

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::InstallProbe(FunctionBody *this,int offset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ByteBlock *pBVar4;
  byte *initialContent;
  ArenaAllocator *alloc;
  undefined4 *puVar5;
  ByteBlock *probeBackingBlock;
  ArenaAllocator *pArena;
  byte *pbyteCodeBlockBuffer;
  int offset_local;
  FunctionBody *this_local;
  
  if (-1 < offset) {
    pBVar4 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
    uVar3 = ByteBlock::GetLength(pBVar4);
    if (offset + 1U < uVar3) {
      pBVar4 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
      initialContent = ByteBlock::GetBuffer(pBVar4);
      pBVar4 = GetProbeBackingBlock(this);
      if (pBVar4 == (ByteBlock *)0x0) {
        alloc = ScriptContext::AllocatorForDiagnostics
                          ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
        if (alloc == (ArenaAllocator *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x100f,"(pArena)","pArena");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pBVar4 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
        uVar3 = ByteBlock::GetLength(pBVar4);
        pBVar4 = ByteBlock::NewFromArena(alloc,initialContent,uVar3);
        SetProbeBackingBlock(this,pBVar4);
      }
      bVar2 = OpCodeUtil::IsSmallEncodedOpcode(Break);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1015,"(OpCodeUtil::IsSmallEncodedOpcode(OpCode::Break))",
                                    "OpCodeUtil::IsSmallEncodedOpcode(OpCode::Break)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = OpCodeAttr::HasMultiSizeLayout(Break);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1017,"(!OpCodeAttr::HasMultiSizeLayout(OpCode::Break))",
                                    "!OpCodeAttr::HasMultiSizeLayout(OpCode::Break)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      initialContent[offset] = '\b';
      (this->m_sourceInfo).m_probeCount = (this->m_sourceInfo).m_probeCount + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool FunctionBody::InstallProbe(int offset)
    {
        if (offset < 0 || ((uint)offset + 1) >= byteCodeBlock->GetLength())
        {
            return false;
        }

        byte* pbyteCodeBlockBuffer = this->byteCodeBlock->GetBuffer();

        if(!GetProbeBackingBlock())
        {
            // The probe backing block is set on a different thread than the main thread
            // The recycler doesn't like allocations from a different thread, so we allocate
            // the backing byte code block in the arena
            ArenaAllocator *pArena = m_scriptContext->AllocatorForDiagnostics();
            Assert(pArena);
            ByteBlock* probeBackingBlock = ByteBlock::NewFromArena(pArena, pbyteCodeBlockBuffer, byteCodeBlock->GetLength());
            SetProbeBackingBlock(probeBackingBlock);
        }

        // Make sure Break opcode only need one byte
        Assert(OpCodeUtil::IsSmallEncodedOpcode(OpCode::Break));
#if ENABLE_NATIVE_CODEGEN
        Assert(!OpCodeAttr::HasMultiSizeLayout(OpCode::Break));
#endif
        *(byte *)(pbyteCodeBlockBuffer + offset) = (byte)OpCode::Break;

        ++m_sourceInfo.m_probeCount;

        return true;
    }